

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int deflate(z_streamp_conflict strm,int flush)

{
  Bytef BVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deflate_state *s;
  Bytef *pBVar5;
  Bytef *pBVar6;
  Bytef *pBVar7;
  Posf *__s;
  uint uVar8;
  bool bVar9;
  Bytef BVar10;
  block_state bVar11;
  uLong uVar12;
  ulong uVar13;
  uint uVar14;
  gz_headerp pgVar15;
  uInt uVar16;
  uint uVar17;
  
  if (strm == (z_streamp_conflict)0x0) {
    return -2;
  }
  s = (deflate_state *)strm->state;
  if (5 < (uint)flush || s == (deflate_state *)0x0) {
    return -2;
  }
  if ((strm->next_out == (Bytef *)0x0) ||
     (((strm->next_in == (Bytef *)0x0 && (strm->avail_in != 0)) ||
      (flush != 4 && s->status == 0x29a)))) {
    strm->msg = "stream error";
    return -2;
  }
  if (strm->avail_out == 0) goto LAB_0043f8dd;
  s->strm = strm;
  iVar2 = s->last_flush;
  s->last_flush = flush;
  if (s->status == 0x2a) {
    if (s->wrap == 2) {
      uVar12 = crc32(0,(uchar *)0x0,0);
      strm->adler = uVar12;
      uVar17 = s->pending;
      s->pending = uVar17 + 1;
      s->pending_buf[uVar17] = '\x1f';
      uVar17 = s->pending;
      s->pending = uVar17 + 1;
      s->pending_buf[uVar17] = 0x8b;
      uVar17 = s->pending;
      s->pending = uVar17 + 1;
      s->pending_buf[uVar17] = '\b';
      pgVar15 = s->gzhead;
      if (pgVar15 == (gz_headerp)0x0) {
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = '\0';
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = '\0';
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = '\0';
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = '\0';
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = '\0';
        BVar10 = '\x02';
        if (s->level != 9) {
          BVar10 = (s->level < 2 || 1 < s->strategy) << 2;
        }
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = '\x03';
        s->status = 0x71;
      }
      else {
        iVar3 = pgVar15->text;
        iVar4 = pgVar15->hcrc;
        pBVar5 = pgVar15->extra;
        pBVar6 = pgVar15->name;
        pBVar7 = pgVar15->comment;
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] =
             (pBVar7 != (Bytef *)0x0) << 4 |
             (pBVar6 != (Bytef *)0x0) << 3 |
             (pBVar5 != (Bytef *)0x0) << 2 | (iVar4 != 0) * '\x02' | iVar3 != 0;
        uVar12 = s->gzhead->time;
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = (Bytef)uVar12;
        BVar10 = *(Bytef *)((long)&s->gzhead->time + 1);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        BVar10 = *(Bytef *)((long)&s->gzhead->time + 2);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        BVar10 = *(Bytef *)((long)&s->gzhead->time + 3);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        BVar10 = '\x02';
        if (s->level != 9) {
          BVar10 = (s->level < 2 || 1 < s->strategy) << 2;
        }
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        iVar3 = s->gzhead->os;
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = (Bytef)iVar3;
        if (s->gzhead->extra != (Bytef *)0x0) {
          uVar16 = s->gzhead->extra_len;
          uVar17 = s->pending;
          s->pending = uVar17 + 1;
          s->pending_buf[uVar17] = (Bytef)uVar16;
          BVar10 = *(Bytef *)((long)&s->gzhead->extra_len + 1);
          uVar17 = s->pending;
          s->pending = uVar17 + 1;
          s->pending_buf[uVar17] = BVar10;
        }
        if (s->gzhead->hcrc != 0) {
          uVar12 = crc32(strm->adler,s->pending_buf,s->pending);
          strm->adler = uVar12;
        }
        s->gzindex = 0;
        s->status = 0x45;
      }
    }
    else {
      uVar17 = s->w_bits * 0x1000 - 0x7800;
      uVar14 = 0;
      if ((s->strategy < 2) && (iVar3 = s->level, 1 < iVar3)) {
        uVar14 = 0x40;
        if (5 < iVar3) {
          uVar14 = (iVar3 != 6 | 2) << 6;
        }
      }
      uVar8 = uVar14 + 0x20 + uVar17;
      if (s->strstart == 0) {
        uVar8 = uVar14 | uVar17;
      }
      s->status = 0x71;
      uVar17 = s->pending;
      s->pending = uVar17 + 1;
      s->pending_buf[uVar17] = (Bytef)(uVar8 >> 8);
      uVar17 = s->pending;
      s->pending = uVar17 + 1;
      s->pending_buf[uVar17] =
           (((char)(uVar8 / 0x1f) - (char)(uVar8 / 0x1f << 5)) + (byte)uVar8 | (byte)uVar8) ^ 0x1f;
      if (s->strstart != 0) {
        BVar10 = *(Bytef *)((long)&strm->adler + 2);
        BVar1 = *(Bytef *)((long)&strm->adler + 3);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar1;
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        uVar12 = strm->adler;
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = (Bytef)(uVar12 >> 8);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = (Bytef)uVar12;
      }
      uVar12 = adler32(0,(Bytef *)0x0,0);
      strm->adler = uVar12;
    }
  }
  if (s->status == 0x45) {
    if (s->gzhead->extra != (Bytef *)0x0) {
      uVar13 = (ulong)s->pending;
      pgVar15 = s->gzhead;
      if (s->gzindex < (uint)(ushort)pgVar15->extra_len) {
        do {
          uVar17 = s->pending;
          if (s->pending_buf_size == (ulong)uVar17) {
            if ((pgVar15->hcrc != 0) &&
               (uVar16 = uVar17 - (uint)uVar13, (uint)uVar13 <= uVar17 && uVar16 != 0)) {
              uVar12 = crc32(strm->adler,s->pending_buf + uVar13,uVar16);
              strm->adler = uVar12;
            }
            flush_pending(strm);
            uVar13 = (ulong)s->pending;
            if (s->pending_buf_size == uVar13) break;
          }
          BVar10 = s->gzhead->extra[s->gzindex];
          uVar17 = s->pending;
          s->pending = uVar17 + 1;
          s->pending_buf[uVar17] = BVar10;
          uVar17 = s->gzindex + 1;
          s->gzindex = uVar17;
          pgVar15 = s->gzhead;
        } while (uVar17 < (ushort)pgVar15->extra_len);
      }
      if ((s->gzhead->hcrc != 0) &&
         (uVar16 = s->pending - (uint)uVar13, (uint)uVar13 <= s->pending && uVar16 != 0)) {
        uVar12 = crc32(strm->adler,s->pending_buf + uVar13,uVar16);
        strm->adler = uVar12;
      }
      if (s->gzindex != s->gzhead->extra_len) goto LAB_0043f69f;
      s->gzindex = 0;
    }
    s->status = 0x49;
  }
LAB_0043f69f:
  if (s->status == 0x49) {
    if (s->gzhead->name != (Bytef *)0x0) {
      uVar13 = (ulong)s->pending;
      do {
        uVar17 = s->pending;
        if (s->pending_buf_size == (ulong)uVar17) {
          if ((s->gzhead->hcrc != 0) &&
             (uVar16 = uVar17 - (uint)uVar13, (uint)uVar13 <= uVar17 && uVar16 != 0)) {
            uVar12 = crc32(strm->adler,s->pending_buf + uVar13,uVar16);
            strm->adler = uVar12;
          }
          flush_pending(strm);
          uVar17 = s->pending;
          uVar13 = (ulong)uVar17;
          if (s->pending_buf_size == uVar13) {
            bVar9 = false;
            goto LAB_0043f726;
          }
        }
        uVar17 = (uint)uVar13;
        pBVar5 = s->gzhead->name;
        uVar14 = s->gzindex;
        s->gzindex = uVar14 + 1;
        BVar10 = pBVar5[uVar14];
        uVar14 = s->pending;
        s->pending = uVar14 + 1;
        s->pending_buf[uVar14] = BVar10;
      } while (BVar10 != '\0');
      bVar9 = true;
LAB_0043f726:
      if ((s->gzhead->hcrc != 0) &&
         (uVar16 = s->pending - uVar17, uVar17 <= s->pending && uVar16 != 0)) {
        uVar12 = crc32(strm->adler,s->pending_buf + uVar17,uVar16);
        strm->adler = uVar12;
      }
      if (!bVar9) goto LAB_0043f75d;
      s->gzindex = 0;
    }
    s->status = 0x5b;
  }
LAB_0043f75d:
  if (s->status == 0x5b) {
    if (s->gzhead->comment != (Bytef *)0x0) {
      uVar13 = (ulong)s->pending;
      do {
        uVar17 = s->pending;
        if (s->pending_buf_size == (ulong)uVar17) {
          if ((s->gzhead->hcrc != 0) &&
             (uVar16 = uVar17 - (uint)uVar13, (uint)uVar13 <= uVar17 && uVar16 != 0)) {
            uVar12 = crc32(strm->adler,s->pending_buf + uVar13,uVar16);
            strm->adler = uVar12;
          }
          flush_pending(strm);
          uVar17 = s->pending;
          uVar13 = (ulong)uVar17;
          if (s->pending_buf_size == uVar13) {
            bVar9 = false;
            goto LAB_0043f7e4;
          }
        }
        uVar17 = (uint)uVar13;
        pBVar5 = s->gzhead->comment;
        uVar14 = s->gzindex;
        s->gzindex = uVar14 + 1;
        BVar10 = pBVar5[uVar14];
        uVar14 = s->pending;
        s->pending = uVar14 + 1;
        s->pending_buf[uVar14] = BVar10;
      } while (BVar10 != '\0');
      bVar9 = true;
LAB_0043f7e4:
      if ((s->gzhead->hcrc != 0) &&
         (uVar16 = s->pending - uVar17, uVar17 <= s->pending && uVar16 != 0)) {
        uVar12 = crc32(strm->adler,s->pending_buf + uVar17,uVar16);
        strm->adler = uVar12;
      }
      if (!bVar9) goto LAB_0043f814;
    }
    s->status = 0x67;
  }
LAB_0043f814:
  if (s->status == 0x67) {
    if (s->gzhead->hcrc != 0) {
      if (s->pending_buf_size < (ulong)(s->pending + 2)) {
        flush_pending(strm);
      }
      uVar17 = s->pending;
      if (s->pending_buf_size < (ulong)(uVar17 + 2)) goto LAB_0043f87f;
      uVar12 = strm->adler;
      s->pending = uVar17 + 1;
      s->pending_buf[uVar17] = (Bytef)uVar12;
      BVar10 = *(Bytef *)((long)&strm->adler + 1);
      uVar17 = s->pending;
      s->pending = uVar17 + 1;
      s->pending_buf[uVar17] = BVar10;
      uVar12 = crc32(0,(uchar *)0x0,0);
      strm->adler = uVar12;
    }
    s->status = 0x71;
  }
LAB_0043f87f:
  if (s->pending == 0) {
    if (((strm->avail_in == 0) && (flush != 4)) && (flush <= iVar2)) goto LAB_0043f8dd;
  }
  else {
    flush_pending(strm);
    if (strm->avail_out == 0) goto LAB_0043fa9a;
  }
  if ((s->status != 0x29a) || (strm->avail_in == 0)) {
    if ((strm->avail_in != 0) || ((flush != 0 && s->status != 0x29a || (s->lookahead != 0)))) {
      if (s->strategy == 3) {
        bVar11 = deflate_rle(s,flush);
      }
      else if (s->strategy == 2) {
        bVar11 = deflate_huff(s,flush);
      }
      else {
        bVar11 = (*configuration_table[s->level].func)(s,flush);
      }
      if ((bVar11 & ~block_done) == finish_started) {
        s->status = 0x29a;
      }
      if ((bVar11 & ~finish_started) == need_more) {
        if (strm->avail_out != 0) {
          return 0;
        }
        s->last_flush = -1;
        return 0;
      }
      if (bVar11 == block_done) {
        if (flush != 5) {
          if (flush == 1) {
            _tr_align(s);
          }
          else {
            _tr_stored_block(s,(charf *)0x0,0,0);
            if (flush == 3) {
              __s = s->head;
              uVar13 = (ulong)(s->hash_size - 1);
              __s[uVar13] = 0;
              memset(__s,0,uVar13 * 2);
              if (s->lookahead == 0) {
                s->strstart = 0;
                s->block_start = 0;
              }
            }
          }
        }
        flush_pending(strm);
        if (strm->avail_out == 0) {
LAB_0043fa9a:
          s->last_flush = -1;
          return 0;
        }
      }
    }
    if (flush != 4) {
      return 0;
    }
    if (0 < s->wrap) {
      uVar12 = strm->adler;
      if (s->wrap == 2) {
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = (Bytef)uVar12;
        BVar10 = *(Bytef *)((long)&strm->adler + 1);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        BVar10 = *(Bytef *)((long)&strm->adler + 2);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        BVar10 = *(Bytef *)((long)&strm->adler + 3);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        uVar12 = strm->total_in;
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = (Bytef)uVar12;
        BVar10 = *(Bytef *)((long)&strm->total_in + 1);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        BVar10 = *(Bytef *)((long)&strm->total_in + 2);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = BVar10;
        uVar13 = strm->total_in >> 0x18;
      }
      else {
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = (Bytef)(uVar12 >> 0x18);
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = (Bytef)(uVar12 >> 0x10);
        uVar13 = strm->adler;
        uVar17 = s->pending;
        s->pending = uVar17 + 1;
        s->pending_buf[uVar17] = (Bytef)(uVar13 >> 8);
      }
      uVar17 = s->pending;
      s->pending = uVar17 + 1;
      s->pending_buf[uVar17] = (Bytef)uVar13;
      flush_pending(strm);
      if (0 < s->wrap) {
        s->wrap = -s->wrap;
      }
      return (uint)(s->pending == 0);
    }
    return 1;
  }
LAB_0043f8dd:
  strm->msg = "buffer error";
  return -5;
}

Assistant:

int ZEXPORT deflate (z_streamp strm, int flush)
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        flush > Z_BLOCK || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->next_in == Z_NULL && strm->avail_in != 0) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    s->strm = strm; /* just in case */
    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Write the header */
    if (s->status == INIT_STATE) {
#ifdef GZIP
        if (s->wrap == 2) {
            strm->adler = crc32(0L, Z_NULL, 0);
            put_byte(s, 31);
            put_byte(s, 139);
            put_byte(s, 8);
            if (s->gzhead == Z_NULL) {
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, OS_CODE);
                s->status = BUSY_STATE;
            }
            else {
                put_byte(s, (s->gzhead->text ? 1 : 0) +
                            (s->gzhead->hcrc ? 2 : 0) +
                            (s->gzhead->extra == Z_NULL ? 0 : 4) +
                            (s->gzhead->name == Z_NULL ? 0 : 8) +
                            (s->gzhead->comment == Z_NULL ? 0 : 16)
                        );
                put_byte(s, (Byte)(s->gzhead->time & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 8) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 16) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 24) & 0xff));
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, s->gzhead->os & 0xff);
                if (s->gzhead->extra != Z_NULL) {
                    put_byte(s, s->gzhead->extra_len & 0xff);
                    put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
                }
                if (s->gzhead->hcrc)
                    strm->adler = crc32(strm->adler, s->pending_buf,
                                        s->pending);
                s->gzindex = 0;
                s->status = EXTRA_STATE;
            }
        }
        else
#endif
        {
            uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
            uInt level_flags;

            if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
                level_flags = 0;
            else if (s->level < 6)
                level_flags = 1;
            else if (s->level == 6)
                level_flags = 2;
            else
                level_flags = 3;
            header |= (level_flags << 6);
            if (s->strstart != 0) header |= PRESET_DICT;
            header += 31 - (header % 31);

            s->status = BUSY_STATE;
            putShortMSB(s, header);

            /* Save the adler32 of the preset dictionary: */
            if (s->strstart != 0) {
                putShortMSB(s, (uInt)(strm->adler >> 16));
                putShortMSB(s, (uInt)(strm->adler & 0xffff));
            }
            strm->adler = adler32(0L, Z_NULL, 0);
        }
    }
#ifdef GZIP
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != Z_NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */

            while (s->gzindex < (s->gzhead->extra_len & 0xffff)) {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size)
                        break;
                }
                put_byte(s, s->gzhead->extra[s->gzindex]);
                s->gzindex++;
            }
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (s->gzindex == s->gzhead->extra_len) {
                s->gzindex = 0;
                s->status = NAME_STATE;
            }
        }
        else
            s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != Z_NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0) {
                s->gzindex = 0;
                s->status = COMMENT_STATE;
            }
        }
        else
            s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != Z_NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0)
                s->status = HCRC_STATE;
        }
        else
            s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size)
                flush_pending(strm);
            if (s->pending + 2 <= s->pending_buf_size) {
                put_byte(s, (Byte)(strm->adler & 0xff));
                put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
                strm->adler = crc32(0L, Z_NULL, 0);
                s->status = BUSY_STATE;
            }
        }
        else
            s->status = BUSY_STATE;
    }
#endif

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && flush <= old_flush &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = s->strategy == Z_HUFFMAN_ONLY ? deflate_huff(s, flush) :
                    (s->strategy == Z_RLE ? deflate_rle(s, flush) :
                        (*(configuration_table[s->level].func))(s, flush));

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else if (flush != Z_BLOCK) { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                    if (s->lookahead == 0) {
                        s->strstart = 0;
                        s->block_start = 0L;
                    }
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }
    Assert(strm->avail_out > 0, "bug2");

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (Byte)(strm->adler & 0xff));
        put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 16) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 24) & 0xff));
        put_byte(s, (Byte)(strm->total_in & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 8) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 16) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}